

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gibbs.cpp
# Opt level: O0

void __thiscall
merlin::gibbs::write_solution
          (gibbs *this,ostream *out,
          map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          *evidence,
          map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          *old2new,graphical_model *orig,
          set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *dummies,
          int output_format)

{
  double dVar1;
  mapped_type mVar2;
  ulong uVar3;
  key_type kVar4;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *pmVar5;
  bool bVar6;
  Type TVar7;
  _Setprecision _Var8;
  ostream *poVar9;
  size_type sVar10;
  size_t sVar11;
  mapped_type *pmVar12;
  size_type sVar13;
  runtime_error *this_00;
  double dVar14;
  double local_3b8;
  double local_280;
  allocator local_1e9;
  string local_1e8 [8];
  string err_msg;
  vindex j_1;
  out_of_range *e_3;
  size_t val_3;
  _Self local_1a8;
  key_type local_1a0;
  vindex i_3;
  size_t k_3;
  variable VX_1;
  vindex vx_1;
  out_of_range *e_2;
  ulong local_148;
  size_t k_2;
  size_t val_2;
  variable v_1;
  _Self local_120;
  key_type local_118;
  vindex i_2;
  vindex j;
  out_of_range *e_1;
  size_t val_1;
  _Self local_f0;
  key_type local_e8;
  vindex i_1;
  size_t k_1;
  variable VX;
  vindex vx;
  out_of_range *e;
  ulong local_88;
  size_t k;
  size_t val;
  variable v;
  _Self local_50;
  key_type local_48;
  vindex i;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *local_38;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *dummies_local;
  graphical_model *orig_local;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *old2new_local;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *evidence_local;
  ostream *out_local;
  gibbs *this_local;
  
  local_38 = dummies;
  dummies_local =
       (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)orig;
  orig_local = (graphical_model *)old2new;
  old2new_local = evidence;
  evidence_local =
       (map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
        *)out;
  out_local = (ostream *)this;
  if (output_format == 0xb) {
    std::operator<<(out,"{");
    std::operator<<((ostream *)evidence_local," \"algorithm\" : \"gibbs\", ");
    poVar9 = std::operator<<((ostream *)evidence_local," \"samples\" : ");
    sVar10 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::size(&this->m_samples);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,sVar10);
    std::operator<<(poVar9,", ");
    TVar7 = Task::operator_cast_to_Type(&this->m_task);
    if (TVar7 == MAR) {
      std::operator<<((ostream *)evidence_local," \"task\" : \"MAR\", ");
      poVar9 = std::operator<<((ostream *)evidence_local," \"value\" : ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::fixed);
      i._4_4_ = std::setprecision(6);
      poVar9 = std::operator<<(poVar9,i._4_4_);
      dVar1 = this->m_lb;
      dVar14 = graphical_model::get_global_const((graphical_model *)dummies_local);
      dVar14 = ::log(dVar14);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar1 + dVar14);
      std::operator<<(poVar9,", ");
      std::operator<<((ostream *)evidence_local," \"status\" : \"true\", ");
      std::operator<<((ostream *)evidence_local," \"marginals\" : [ ");
      for (local_48 = 0; kVar4 = local_48,
          sVar11 = graphical_model::nvar((graphical_model *)dummies_local), kVar4 < sVar11;
          local_48 = local_48 + 1) {
        local_50._M_node =
             (_Base_ptr)
             std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::find
                       (local_38,&local_48);
        v.m_states = (size_t)std::
                             set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                             ::end(local_38);
        bVar6 = std::operator!=(&local_50,(_Self *)&v.m_states);
        if (!bVar6) {
          _val = graphical_model::var((graphical_model *)dummies_local,local_48);
          std::operator<<((ostream *)evidence_local,"{");
          poVar9 = std::operator<<((ostream *)evidence_local," \"variable\" : ");
          sVar11 = variable::label((variable *)&val);
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,sVar11);
          std::operator<<(poVar9,", ");
          poVar9 = std::operator<<((ostream *)evidence_local," \"states\" : ");
          sVar11 = variable::states((variable *)&val);
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,sVar11);
          std::operator<<(poVar9,", ");
          std::operator<<((ostream *)evidence_local," \"probabilities\" : [");
          pmVar12 = std::
                    map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                    ::at(old2new_local,&local_48);
          mVar2 = *pmVar12;
          for (local_88 = 0; sVar11 = variable::states((variable *)&val), local_88 < sVar11;
              local_88 = local_88 + 1) {
            poVar9 = (ostream *)std::ostream::operator<<(evidence_local,std::fixed);
            _Var8 = std::setprecision(6);
            poVar9 = std::operator<<(poVar9,_Var8);
            local_280 = 1.0;
            if (local_88 != mVar2) {
              local_280 = 0.0;
            }
            std::ostream::operator<<(poVar9,local_280);
            sVar11 = variable::states((variable *)&val);
            if (local_88 != sVar11 - 1) {
              std::operator<<((ostream *)evidence_local,", ");
            }
          }
          std::operator<<((ostream *)evidence_local,"] ");
          std::operator<<((ostream *)evidence_local,"}");
          kVar4 = local_48;
          sVar11 = graphical_model::nvar((graphical_model *)dummies_local);
          if (kVar4 != sVar11 - 1) {
            std::operator<<((ostream *)evidence_local,", ");
          }
        }
      }
      std::operator<<((ostream *)evidence_local,"] ");
    }
    else if (TVar7 == MAP) {
      std::operator<<((ostream *)evidence_local," \"task\" : \"MAP\", ");
      poVar9 = std::operator<<((ostream *)evidence_local," \"value\" : ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::fixed);
      i_1._4_4_ = std::setprecision(6);
      poVar9 = std::operator<<(poVar9,i_1._4_4_);
      dVar1 = this->m_lb;
      dVar14 = graphical_model::get_global_const((graphical_model *)dummies_local);
      dVar14 = ::log(dVar14);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar1 + dVar14);
      std::operator<<(poVar9,", ");
      std::operator<<((ostream *)evidence_local," \"status\" : \"true\", ");
      std::operator<<((ostream *)evidence_local," \"solution\" : [ ");
      for (local_e8 = 0; kVar4 = local_e8,
          sVar11 = graphical_model::nvar((graphical_model *)dummies_local), kVar4 < sVar11;
          local_e8 = local_e8 + 1) {
        local_f0._M_node =
             (_Base_ptr)
             std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::find
                       (local_38,&local_e8);
        val_1 = (size_t)std::
                        set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                        ::end(local_38);
        bVar6 = std::operator!=(&local_f0,(_Self *)&val_1);
        if (!bVar6) {
          std::operator<<((ostream *)evidence_local,"{");
          poVar9 = std::operator<<((ostream *)evidence_local," \"variable\" : ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_e8);
          std::operator<<(poVar9,",");
          pmVar12 = std::
                    map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                    ::at(old2new_local,&local_e8);
          e_1 = (out_of_range *)*pmVar12;
          poVar9 = std::operator<<((ostream *)evidence_local," \"value\" : ");
          std::ostream::operator<<(poVar9,(ulong)e_1);
          std::operator<<((ostream *)evidence_local,"}");
          kVar4 = local_e8;
          sVar11 = graphical_model::nvar((graphical_model *)dummies_local);
          if (kVar4 != sVar11 - 1) {
            std::operator<<((ostream *)evidence_local,", ");
          }
        }
      }
      std::operator<<((ostream *)evidence_local,"] ");
    }
  }
  else {
    if (output_format != 10) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1e8,"Unknown output format",&local_1e9);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,local_1e8);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    TVar7 = Task::operator_cast_to_Type(&this->m_task);
    if (TVar7 == MAR) {
      poVar9 = std::operator<<((ostream *)evidence_local,"MAR");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      pmVar5 = evidence_local;
      sVar11 = graphical_model::nvar((graphical_model *)dummies_local);
      sVar13 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
               size(local_38);
      std::ostream::operator<<(pmVar5,sVar11 - sVar13);
      for (local_118 = 0; kVar4 = local_118,
          sVar11 = graphical_model::nvar((graphical_model *)dummies_local), kVar4 < sVar11;
          local_118 = local_118 + 1) {
        local_120._M_node =
             (_Base_ptr)
             std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::find
                       (local_38,&local_118);
        v_1.m_states = (size_t)std::
                               set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                               ::end(local_38);
        bVar6 = std::operator!=(&local_120,(_Self *)&v_1.m_states);
        if (!bVar6) {
          _val_2 = graphical_model::var((graphical_model *)dummies_local,local_118);
          pmVar12 = std::
                    map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                    ::at(old2new_local,&local_118);
          mVar2 = *pmVar12;
          poVar9 = std::operator<<((ostream *)evidence_local," ");
          sVar11 = variable::states((variable *)&val_2);
          std::ostream::operator<<(poVar9,sVar11);
          for (local_148 = 0; sVar11 = variable::states((variable *)&val_2), local_148 < sVar11;
              local_148 = local_148 + 1) {
            poVar9 = std::operator<<((ostream *)evidence_local," ");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::fixed);
            _Var8 = std::setprecision(6);
            poVar9 = std::operator<<(poVar9,_Var8);
            local_3b8 = 1.0;
            if (local_148 != mVar2) {
              local_3b8 = 0.0;
            }
            std::ostream::operator<<(poVar9,local_3b8);
          }
        }
      }
      std::ostream::operator<<(evidence_local,std::endl<char,std::char_traits<char>>);
    }
    else if (TVar7 == MAP) {
      poVar9 = std::operator<<((ostream *)evidence_local,"MAP");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      pmVar5 = evidence_local;
      sVar11 = graphical_model::nvar((graphical_model *)dummies_local);
      sVar13 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
               size(local_38);
      std::ostream::operator<<(pmVar5,sVar11 - sVar13);
      for (local_1a0 = 0; kVar4 = local_1a0,
          sVar11 = graphical_model::nvar((graphical_model *)dummies_local), kVar4 < sVar11;
          local_1a0 = local_1a0 + 1) {
        local_1a8._M_node =
             (_Base_ptr)
             std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::find
                       (local_38,&local_1a0);
        val_3 = (size_t)std::
                        set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                        ::end(local_38);
        bVar6 = std::operator!=(&local_1a8,(_Self *)&val_3);
        if (!bVar6) {
          pmVar12 = std::
                    map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                    ::at(old2new_local,&local_1a0);
          uVar3 = *pmVar12;
          poVar9 = std::operator<<((ostream *)evidence_local," ");
          std::ostream::operator<<(poVar9,uVar3);
        }
      }
      std::ostream::operator<<(evidence_local,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void gibbs::write_solution(std::ostream& out, const std::map<size_t, size_t>& evidence,
		const std::map<size_t, size_t>& old2new, const graphical_model& orig,
		const std::set<size_t>& dummies, int output_format) {

	if (output_format == MERLIN_OUTPUT_JSON) {
		out << "{";
		out << " \"algorithm\" : \"gibbs\", ";
		out << " \"samples\" : " << m_samples.size() << ", ";
		switch (m_task) {
		case Task::MAR:
			{
				out << " \"task\" : \"MAR\", ";
				out << " \"value\" : " << std::fixed
					<< std::setprecision(MERLIN_PRECISION)
					<< (m_lb + std::log(orig.get_global_const())) << ", ";
				out << " \"status\" : \"true\", ";
				out << " \"marginals\" : [ ";
				for (vindex i = 0; i < orig.nvar(); ++i) {
					if (dummies.find(i) != dummies.end()) {
						continue; // skip dummy variables from output
					}

					variable v = orig.var(i);
					out << "{";
					out << " \"variable\" : " << v.label() << ", ";
					out << " \"states\" : " << v.states() << ", ";
					out << " \"probabilities\" : [";
					try { // evidence variable
						size_t val = evidence.at(i);
						for (size_t k = 0; k < v.states(); ++k) {
							out << std::fixed
								<< std::setprecision(MERLIN_PRECISION)
								<< (k == val ? 1.0 : 0.0);
							if (k != v.states() - 1) {
								out << ", ";
							}
						}
						out << "] ";
					} catch(std::out_of_range& e) { // non-evidence variable
						vindex vx = old2new.at(i);
						variable VX = var(vx);
						for (size_t k = 0; k < VX.states(); ++k) {
							out << std::fixed
								<< std::setprecision(MERLIN_PRECISION)
								<< belief(VX)[k];
							if (k != VX.states() - 1) {
								out << ", ";
							}
						}
						out << "] ";
					}

					out << "}";
					if (i != orig.nvar() - 1) {
						out << ", ";
					}
				} // end for
				out << "] ";
				break;
			}
		case Task::MAP:
			{
				out << " \"task\" : \"MAP\", ";
				out << " \"value\" : " << std::fixed
					<< std::setprecision(MERLIN_PRECISION)
					<< (m_lb + std::log(orig.get_global_const())) << ", ";
				out << " \"status\" : \"true\", ";
				out << " \"solution\" : [ ";
				for (vindex i = 0; i < orig.nvar(); ++i) {
					if (dummies.find(i) != dummies.end()) {
						continue; // skip dummy variables from output
					}

					out << "{";
					out << " \"variable\" : " << i << ",";

					try { // evidence variable
						size_t val = evidence.at(i);
						out << " \"value\" : " << val;
					} catch(std::out_of_range& e) { // non-evidence variable
						vindex j = old2new.at(i);
						out << " \"value\" : " << m_best_config[j];
					}
					out << "}";
					if (i != orig.nvar() - 1) {
						out << ", ";
					}
				}
				out << "] ";
				break;
			}
		default:
			break;
		} // end switch
	} else if (output_format == MERLIN_OUTPUT_UAI) {
		// Ouput marginals (ie, beliefs)
		switch (m_task) {
		case Task::MAR:
			{
				out << "MAR" << std::endl;
				out << orig.nvar() - dummies.size();
				for (vindex i = 0; i < orig.nvar(); ++i) {
					if (dummies.find(i) != dummies.end()) {
						continue; // skip dummy variables from output
					}

					variable v = orig.var(i);
					try { // evidence variable
						size_t val = evidence.at(i);
						out << " " << v.states();
						for (size_t k = 0; k < v.states(); ++k) {
							out << " " << std::fixed
								<< std::setprecision(MERLIN_PRECISION)
								<< (k == val ? 1.0 : 0.0);
						}
					} catch(std::out_of_range& e) { // non-evidence variable
						vindex vx = old2new.at(i);
						variable VX = var(vx);
						out << " " << VX.states();
						for (size_t k = 0; k < VX.states(); ++k) {
							out << " " << std::fixed
								<< std::setprecision(MERLIN_PRECISION)
								<< belief(VX)[k];
						}
					}
				} // end for
				out << std::endl;
				break;
			}
		case Task::MAP:
			{
				out << "MAP" << std::endl;
				out << orig.nvar() - dummies.size();
				for (vindex i = 0; i < orig.nvar(); ++i) {
					if (dummies.find(i) != dummies.end()) {
						continue; // skip dummy variables from output
					}

					try { // evidence variable
						size_t val = evidence.at(i);
						out << " " << val;
					} catch(std::out_of_range& e) { // non-evidence variable
						vindex j = old2new.at(i);
						out << " " << m_best_config[j];
					}
				}
				out << std::endl;
				break;
			}
		default:
			break;
		} // end switch
	} else {
		std::string err_msg("Unknown output format");
		throw std::runtime_error(err_msg);
	}
}